

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

void SldAddCommentKeyword(char *keyword)

{
  pointer pbVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  allocator<char> local_31;
  char *keyword_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  pbVar1 = sldCommentKeywords_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  keyword_local = keyword;
  if ((keyword == (char *)0x0) || (*keyword == '\0')) {
    if (pass == 3) {
      Error("[SLDOPT COMMENT] invalid keyword",lp,SUPPRESS);
      return;
    }
  }
  else if (pass == 1) {
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                      (sldCommentKeywords_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       sldCommentKeywords_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&keyword_local);
    if (_Var2._M_current == pbVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,keyword_local,&local_31);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &sldCommentKeywords_abi_cxx11_,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
    }
  }
  return;
}

Assistant:

void SldAddCommentKeyword(const char* keyword) {
	if (nullptr == keyword || !keyword[0]) {
		if (LASTPASS == pass) Error("[SLDOPT COMMENT] invalid keyword", lp, SUPPRESS);
		return;
	}
	if (1 == pass) {
		auto begin = sldCommentKeywords.cbegin();
		auto end = sldCommentKeywords.cend();
		// add keyword only if it is new (not included yet)
		if (std::find(begin, end, keyword) == end) sldCommentKeywords.push_back(keyword);
	}
}